

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::DirectStateAccess::VertexArrays::Utilities::itoa_abi_cxx11_
          (string *__return_storage_ptr__,Utilities *this,GLuint i)

{
  stringstream ss;
  string local_1c0 [32];
  allocator<char> local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,local_1a0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Utilities::itoa(glw::GLuint i)
{
	std::string s = "";

	std::stringstream ss;

	ss << i;

	s = ss.str();

	return s;
}